

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::NewCharClass(CharClass *cc,ParseFlags flags)

{
  Regexp *this;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 in_RDI;
  Regexp *re;
  ParseFlags in_stack_ffffffffffffffc8;
  RegexpOp in_stack_ffffffffffffffcc;
  
  this = (Regexp *)operator_new(0x28);
  Regexp(this,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  (this->field_7).field_0 = in_RDI;
  return this;
}

Assistant:

Regexp* Regexp::NewCharClass(CharClass* cc, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpCharClass, flags);
  re->cc_ = cc;
  return re;
}